

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  uint uVar1;
  Error EVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *str;
  ulong uVar6;
  
  uVar1 = (op->field_0)._any.signature;
  switch(uVar1 & 7) {
  case 1:
    EVar2 = X86Logging::formatRegister
                      (sb,0x177980,emitter,0x503,uVar1 >> 3 & 0x1f,(op->field_0)._any.id);
    return EVar2;
  case 2:
    break;
  case 3:
    uVar6 = *(ulong *)((long)&op->field_0 + 8);
    if (uVar6 < 10 || (logOptions & 4) == 0) {
      uVar4 = 10;
      uVar5 = 0x80000000;
    }
    else {
      uVar4 = 0x10;
      uVar5 = 0;
    }
    EVar2 = StringBuilder::_opNumber(sb,1,uVar6,uVar4,0,uVar5);
    return EVar2;
  case 4:
    EVar2 = formatLabel(sb,logOptions,emitter,(op->field_0)._any.id);
    return EVar2;
  default:
    EVar2 = StringBuilder::_opString(sb,1,"<None>",0xffffffffffffffff);
    return EVar2;
  }
  uVar1 = uVar1 >> 0x18;
  switch(uVar1) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_0016479b_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar1 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar1 != 0x40) goto switchD_0016479b_caseD_3;
      str = "zword ";
    }
  }
  EVar2 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
  if ((EVar2 == 0) &&
     ((uVar1 = (op->field_0)._any.signature >> 0x15 & 7, 5 < uVar1 - 1 ||
      (EVar2 = StringBuilder::appendFormat(sb,"%s:",(ulong)uVar1 * 4 + 0x177c50), EVar2 == 0)))) {
    uVar4 = 1;
    EVar2 = StringBuilder::_opChar(sb,1,'[');
    if (EVar2 == 0) {
      uVar1 = (op->field_0)._any.signature;
      uVar5 = uVar1 & 0x6000;
      if (uVar5 == 0x2000) {
        uVar4 = 1;
        uVar5 = 0xffffffff;
        EVar2 = StringBuilder::_opString(sb,1,"abs ",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar1 = (op->field_0)._any.signature;
      }
      if ((uVar1 & 0xf8) != 0) {
        if ((uVar1 & 0xf8) == 8) {
          uVar5 = (op->field_0)._any.reserved12_4;
          EVar2 = formatLabel(sb,logOptions,emitter,uVar5);
        }
        else {
          if ((short)uVar1 < 0) {
            uVar4 = 1;
            EVar2 = StringBuilder::_opString(sb,1,"$",0xffffffffffffffff);
            if (EVar2 != 0) {
              return EVar2;
            }
            uVar1 = (op->field_0)._any.signature;
          }
          if ((uVar1 >> 0x10 & 1) != 0) {
            uVar4 = 1;
            EVar2 = StringBuilder::_opString(sb,1,"&",0xffffffffffffffff);
            if (EVar2 != 0) {
              return EVar2;
            }
            uVar1 = (op->field_0)._any.signature;
          }
          uVar5 = 0x503;
          EVar2 = X86Logging::formatRegister
                            (sb,uVar4,emitter,0x503,uVar1 >> 3 & 0x1f,
                             (op->field_0)._any.reserved12_4);
        }
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      uVar1 = (op->field_0)._any.signature;
      if ((uVar1 & 0x1f00) != 0) {
        uVar4 = 1;
        EVar2 = StringBuilder::_opChar(sb,1,'+');
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = X86Logging::formatRegister
                          (sb,uVar4,emitter,uVar5,(op->field_0)._any.signature >> 8 & 0x1f,
                           (op->field_0)._any.id);
        if (EVar2 != 0) {
          return EVar2;
        }
        uVar1 = (op->field_0)._any.signature;
        if ((uVar1 & 0x180000) != 0) {
          EVar2 = StringBuilder::appendFormat
                            (sb,"*%u",(ulong)(uint)(1 << ((byte)(uVar1 >> 0x13) & 3)));
          if (EVar2 != 0) {
            return EVar2;
          }
          uVar1 = (op->field_0)._any.signature;
        }
      }
      uVar6 = *(ulong *)((long)&op->field_0 + 8);
      uVar3 = (long)(int)uVar6;
      if ((uVar1 & 0xf8) == 0) {
        uVar3 = uVar6;
      }
      if (uVar3 == 0) {
LAB_00164a90:
        EVar2 = StringBuilder::_opChar(sb,1,']');
        return EVar2;
      }
      uVar6 = -uVar3;
      if (0 < (long)uVar3) {
        uVar6 = uVar3;
      }
      EVar2 = StringBuilder::_opChar(sb,1,(char)((long)uVar3 >> 0x3f) * -2 + '+');
      if (EVar2 == 0) {
        uVar4 = 10;
        if (((logOptions & 8) != 0) && (9 < uVar6)) {
          EVar2 = StringBuilder::_opString(sb,1,"0x",2);
          if (EVar2 != 0) {
            return EVar2;
          }
          uVar4 = 0x10;
        }
        EVar2 = StringBuilder::_opNumber(sb,1,uVar6,uVar4,0,0);
        if (EVar2 == 0) goto LAB_00164a90;
      }
    }
  }
  return EVar2;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}